

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O3

long __thiscall
mkvparser::Track::ParseContentEncodingsEntry(Track *this,longlong start,longlong size)

{
  long lVar1;
  long lVar2;
  ContentEncoding **ppCVar3;
  ContentEncoding *this_00;
  long lVar4;
  long stop;
  uint uVar5;
  longlong pos;
  longlong size_1;
  longlong id;
  long local_58;
  long local_50;
  IMkvReader *local_48;
  long local_40;
  Track *local_38;
  
  local_48 = this->m_pSegment->m_pReader;
  local_38 = this;
  if (local_48 == (IMkvReader *)0x0) {
    __assert_fail("pReader",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                  ,0x133f,"long mkvparser::Track::ParseContentEncodingsEntry(long long, long long)")
    ;
  }
  stop = size + start;
  uVar5 = 0;
  local_58 = start;
  while (local_58 < stop) {
    lVar2 = ParseElementHeader(local_48,&local_58,stop,&local_40,&local_50);
    if (lVar2 < 0) {
      return lVar2;
    }
    uVar5 = uVar5 + (local_40 == 0x6240);
    local_58 = local_58 + local_50;
    if (stop < local_58) {
      return -2;
    }
  }
  if (uVar5 == 0) {
    return -1;
  }
  ppCVar3 = (ContentEncoding **)operator_new__((ulong)uVar5 << 3,(nothrow_t *)&std::nothrow);
  local_38->content_encoding_entries_ = ppCVar3;
  if (ppCVar3 != (ContentEncoding **)0x0) {
    local_38->content_encoding_entries_end_ = ppCVar3;
    local_58 = start;
    do {
      if (stop <= local_58) {
        return (ulong)(local_58 == stop) * 2 + -2;
      }
      lVar2 = ParseElementHeader(local_48,&local_58,stop,&local_40,&local_50);
      if (lVar2 < 0) {
        return lVar2;
      }
      lVar2 = local_50;
      if (local_40 == 0x6240) {
        this_00 = (ContentEncoding *)operator_new(0x38,(nothrow_t *)&std::nothrow);
        lVar2 = local_50;
        lVar1 = local_58;
        if (this_00 == (ContentEncoding *)0x0) {
          return -1;
        }
        this_00->encryption_entries_ = (ContentEncryption **)0x0;
        this_00->encryption_entries_end_ = (ContentEncryption **)0x0;
        this_00->compression_entries_ = (ContentCompression **)0x0;
        this_00->compression_entries_end_ = (ContentCompression **)0x0;
        this_00->encoding_order_ = 0;
        this_00->encoding_scope_ = 1;
        this_00->encoding_type_ = 0;
        lVar4 = ContentEncoding::ParseContentEncodingEntry(this_00,local_58,local_50,local_48);
        if (lVar4 != 0) {
          ContentEncoding::~ContentEncoding(this_00);
          operator_delete(this_00);
          return lVar4;
        }
        ppCVar3 = local_38->content_encoding_entries_end_;
        local_38->content_encoding_entries_end_ = ppCVar3 + 1;
        *ppCVar3 = this_00;
        local_58 = lVar1;
      }
      local_58 = local_58 + lVar2;
      if (stop < local_58) {
        return -2;
      }
    } while( true );
  }
  return -1;
}

Assistant:

long Track::ParseContentEncodingsEntry(long long start, long long size) {
  IMkvReader* const pReader = m_pSegment->m_pReader;
  assert(pReader);

  long long pos = start;
  const long long stop = start + size;

  // Count ContentEncoding elements.
  int count = 0;
  while (pos < stop) {
    long long id, size;
    const long status = ParseElementHeader(pReader, pos, stop, id, size);
    if (status < 0)  // error
      return status;

    // pos now designates start of element
    if (id == libwebm::kMkvContentEncoding)
      ++count;

    pos += size;  // consume payload
    if (pos > stop)
      return E_FILE_FORMAT_INVALID;
  }

  if (count <= 0)
    return -1;

  content_encoding_entries_ = new (std::nothrow) ContentEncoding*[count];
  if (!content_encoding_entries_)
    return -1;

  content_encoding_entries_end_ = content_encoding_entries_;

  pos = start;
  while (pos < stop) {
    long long id, size;
    long status = ParseElementHeader(pReader, pos, stop, id, size);
    if (status < 0)  // error
      return status;

    // pos now designates start of element
    if (id == libwebm::kMkvContentEncoding) {
      ContentEncoding* const content_encoding =
          new (std::nothrow) ContentEncoding();
      if (!content_encoding)
        return -1;

      status = content_encoding->ParseContentEncodingEntry(pos, size, pReader);
      if (status) {
        delete content_encoding;
        return status;
      }

      *content_encoding_entries_end_++ = content_encoding;
    }

    pos += size;  // consume payload
    if (pos > stop)
      return E_FILE_FORMAT_INVALID;
  }

  if (pos != stop)
    return E_FILE_FORMAT_INVALID;

  return 0;
}